

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

precise_unit units::checkMultiplierCharacter(string *unit_string,uint64_t match_flags,char mchar)

{
  char cVar1;
  precise_unit pVar2;
  __type _Var3;
  size_type __pos;
  size_type sVar4;
  precise_unit pVar5;
  string ustring;
  string local_70;
  string local_50;
  
  ustring._M_dataplus._M_p = (pointer)&ustring.field_2;
  ustring._M_string_length = 0;
  ustring.field_2._M_local_buf[0] = '\0';
  __pos = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     unit_string,mchar,0);
  pVar2.base_units_ = (unit_data)0xfa94a488;
  pVar2.commodity_ = 0;
  pVar2.multiplier_ = NAN;
  if (__pos == 0xffffffffffffffff) goto LAB_0035e4e0;
  sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     unit_string,mchar,__pos + 1);
  if (sVar4 == 0xffffffffffffffff) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ustring,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ustring,__pos,1
              );
    std::__cxx11::string::string
              ((string *)&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ustring);
    pVar5 = unit_quick_match(&local_50,match_flags);
    std::__cxx11::string::~string((string *)&local_50);
    if ((pVar5._8_8_ & 0xffffffff) == 0xfa94a488 || NAN(pVar5.multiplier_)) goto LAB_0035e3ca;
  }
  else {
LAB_0035e3ca:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ustring,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string);
    for (; __pos != 0xffffffffffffffff;
        __pos = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ustring
                       ,mchar,__pos + 2)) {
      if (__pos == ustring._M_string_length - 1) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ustring,
                   __pos,1);
      }
      else {
        cVar1 = ustring._M_dataplus._M_p[__pos + 1];
        if ((byte)(cVar1 - 0x30U) < 10) {
          if (__pos == 0) {
            __pos = 0;
          }
          else if (ustring._M_dataplus._M_p[__pos - 1] != '^') {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ustring,
                   __pos,1,'^');
            __pos = __pos + 1;
          }
        }
        else {
          if (cVar1 == mchar) goto LAB_0035e47d;
          if ((cVar1 != '(') && (cVar1 != '[')) {
            ustring._M_dataplus._M_p[__pos] = '*';
          }
        }
      }
    }
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &ustring,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)unit_string);
    if (_Var3) {
LAB_0035e47d:
      pVar2.base_units_ = (unit_data)0xfa94a488;
      pVar2.commodity_ = 0;
      pVar2.multiplier_ = NAN;
      goto LAB_0035e4e0;
    }
    std::__cxx11::string::string
              ((string *)&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ustring);
    pVar2.base_units_ = (unit_data)0xfa94a488;
    pVar2.commodity_ = 0;
    pVar2.multiplier_ = NAN;
    pVar5 = unit_from_string_internal(&local_70,match_flags | 0x400000000);
    std::__cxx11::string::~string((string *)&local_70);
    if ((pVar5._8_8_ & 0xffffffff) == 0xfa94a488 || NAN(pVar5.multiplier_)) goto LAB_0035e4e0;
  }
  pVar2 = pVar5;
LAB_0035e4e0:
  std::__cxx11::string::~string((string *)&ustring);
  return pVar2;
}

Assistant:

static precise_unit checkMultiplierCharacter(
    const std::string& unit_string,
    std::uint64_t match_flags,
    char mchar)
{
    // assume mchar means multiply
    std::string ustring;
    precise_unit retunit;
    auto fd = unit_string.find_first_of(mchar);
    if (fd != std::string::npos) {
        // if there is a single one just check for a merged unit
        if (unit_string.find_first_of(mchar, fd + 1) == std::string::npos) {
            ustring = unit_string;
            ustring.erase(fd, 1);
            retunit = unit_quick_match(ustring, match_flags);
            if (!is_error(retunit)) {
                return retunit;
            }
        }
        ustring = unit_string;
        while (fd != std::string::npos) {
            if (fd == ustring.size() - 1) {
                ustring.erase(fd, 1);
            } else if (isDigitCharacter(ustring[fd + 1])) {
                if (fd > 0 && ustring[fd - 1] != '^') {
                    ustring.insert(fd, 1, '^');
                    fd += 1;
                }
            } else if (ustring[fd + 1] == mchar) {
                // repeated characters,  cannot mean separator
                return precise::invalid;
            } else if (ustring[fd + 1] != '[' && ustring[fd + 1] != '(') {
                ustring[fd] = '*';
            }
            // ignore adjacent ones
            fd = ustring.find_first_of(mchar, fd + 2);
        }
        if (ustring != unit_string) {
            retunit = unit_from_string_internal(
                ustring, match_flags | skip_partition_check);
            if (!is_error(retunit)) {
                return retunit;
            }
        }
    }
    return precise::invalid;
}